

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

void crnlib::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint table_idx)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint b;
  uint g;
  uint r;
  
  uVar3 = (ulong)table_idx;
  unpack_color5(&r,&g,&b,packed_color5,true);
  iVar1 = (&g_etc1_inten_tables)[uVar3 * 4];
  iVar2 = (&DAT_0018d664)[uVar3 * 4];
  color_quad<unsigned_char,_int>::set(pDst,iVar1 + r,iVar1 + g,iVar1 + b,0xff);
  color_quad<unsigned_char,_int>::set(pDst + 1,iVar2 + r,iVar2 + g,iVar2 + b,0xff);
  iVar1 = *(int *)(&DAT_0018d668 + uVar3 * 0x10);
  color_quad<unsigned_char,_int>::set(pDst + 2,iVar1 + r,iVar1 + g,iVar1 + b,0xff);
  iVar1 = *(int *)(&DAT_0018d66c + uVar3 * 0x10);
  color_quad<unsigned_char,_int>::set(pDst + 3,r + iVar1,g + iVar1,iVar1 + b,0xff);
  return;
}

Assistant:

void etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint table_idx)
    {
        CRNLIB_ASSERT(table_idx < cETC1IntenModifierValues);
        const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

        uint r, g, b;
        unpack_color5(r, g, b, packed_color5, true);

        const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

        const int y0 = pInten_modifer_table[0];
        pDst[0].set(ir + y0, ig + y0, ib + y0);

        const int y1 = pInten_modifer_table[1];
        pDst[1].set(ir + y1, ig + y1, ib + y1);

        const int y2 = pInten_modifer_table[2];
        pDst[2].set(ir + y2, ig + y2, ib + y2);

        const int y3 = pInten_modifer_table[3];
        pDst[3].set(ir + y3, ig + y3, ib + y3);
    }